

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O2

void llvm::APInt::tcSetLeastSignificantBits(WordType *dst,uint parts,uint bits)

{
  ulong uVar1;
  
  uVar1 = 0;
  for (; 0x40 < bits; bits = bits - 0x40) {
    dst[uVar1] = 0xffffffffffffffff;
    uVar1 = uVar1 + 1;
  }
  if (bits != 0) {
    dst[uVar1] = 0xffffffffffffffff >> (-(char)bits & 0x3fU);
    uVar1 = uVar1 + 1;
  }
  for (uVar1 = uVar1 & 0xffffffff; uVar1 < parts; uVar1 = uVar1 + 1) {
    dst[uVar1] = 0;
  }
  return;
}

Assistant:

void APInt::tcSetLeastSignificantBits(WordType *dst, unsigned parts,
                                      unsigned bits) {
  unsigned i = 0;
  while (bits > APINT_BITS_PER_WORD) {
    dst[i++] = ~(WordType) 0;
    bits -= APINT_BITS_PER_WORD;
  }

  if (bits)
    dst[i++] = ~(WordType) 0 >> (APINT_BITS_PER_WORD - bits);

  while (i < parts)
    dst[i++] = 0;
}